

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::SetNetworkMasterKey
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aMasterKey,
          MilliSeconds aDelay)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  char *begin;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string sStack_188;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  parse_func local_140 [1];
  undefined1 local_130 [40];
  PendingOperationalDataset local_108;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  PendingOperationalDataset::PendingOperationalDataset(&local_108);
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_168._0_4_ = none_type;
    local_160._M_p = "the commissioner is not active";
    local_158 = 0x1e;
    local_150._M_allocated_capacity = 0;
    local_140[0] = (parse_func)0x0;
    pcVar4 = "the commissioner is not active";
    local_150._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_168;
    while (begin = pcVar4, begin != "") {
      pcVar4 = begin + 1;
      if (*begin == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_168);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_168;
    ::fmt::v10::vformat_abi_cxx11_(&sStack_188,(v10 *)0x2157e0,(string_view)ZEXT816(0x1e),args);
    local_130._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_130 + 8),(string *)&sStack_188);
    Error::operator=(__return_storage_ptr__,(Error *)local_130);
    std::__cxx11::string::~string((string *)(local_130 + 8));
    std::__cxx11::string::~string((string *)&sStack_188);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_108.super_ActiveOperationalDataset.mNetworkMasterKey,aMasterKey);
    local_108.super_ActiveOperationalDataset._212_4_ = SUB84(aDelay.__r,0);
    local_108.super_ActiveOperationalDataset.mPresentFlags =
         local_108.super_ActiveOperationalDataset.mPresentFlags | 0x420;
    (*((this->mCommissioner).
       super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Commissioner[0x22])(local_168);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_168);
    EVar1 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)&local_160);
    if (EVar1 == kNone) {
      MergeDataset(&this->mPendingDataset,&local_108);
    }
  }
  ActiveOperationalDataset::~ActiveOperationalDataset(&local_108.super_ActiveOperationalDataset);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetNetworkMasterKey(const ByteArray &aMasterKey, MilliSeconds aDelay)
{
    Error                     error;
    PendingOperationalDataset pendingDataset;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    pendingDataset.mNetworkMasterKey = aMasterKey;
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kNetworkMasterKeyBit;

    pendingDataset.mDelayTimer = aDelay.count();
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;

    SuccessOrExit(error = mCommissioner->SetPendingDataset(pendingDataset));

    MergeDataset(mPendingDataset, pendingDataset);

exit:
    return error;
}